

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::JsonUnitTestResultPrinter::OnTestIterationEnd
          (JsonUnitTestResultPrinter *this,UnitTest *unit_test,int param_2)

{
  bool bVar1;
  FILE *__stream;
  ostream *poVar2;
  FilePath output_dir;
  FilePath output_file;
  stringstream stream;
  FilePath local_208;
  FilePath local_1e8;
  string local_1c8;
  GTestLog local_1a8 [4];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  FilePath::FilePath(&local_1e8,&this->output_file_);
  FilePath::RemoveFileName(&local_208,&local_1e8);
  bVar1 = FilePath::CreateDirectoriesRecursively(&local_208);
  if (bVar1) {
    __stream = fopen((this->output_file_)._M_dataplus._M_p,"w");
    if (__stream != (FILE *)0x0) goto LAB_001171dc;
  }
  GTestLog::GTestLog(local_1a8,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ajatprabha[P]CS223_Apr18_02/lib/googletest/src/gtest.cc"
                     ,0xf39);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Unable to open file \"",0x15);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(this->output_file_)._M_dataplus._M_p,
                      (this->output_file_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\"",1);
  GTestLog::~GTestLog(local_1a8);
  __stream = (FILE *)0x0;
LAB_001171dc:
  std::__cxx11::stringstream::stringstream((stringstream *)local_1a8);
  PrintJsonUnitTest(local_198,unit_test);
  StringStreamToString(&local_1c8,(stringstream *)local_1a8);
  fputs(local_1c8._M_dataplus._M_p,__stream);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base(local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208.pathname_._M_dataplus._M_p != &local_208.pathname_.field_2) {
    operator_delete(local_208.pathname_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.pathname_._M_dataplus._M_p != &local_1e8.pathname_.field_2) {
    operator_delete(local_1e8.pathname_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OnTestIterationEnd(const UnitTest& unit_test,
                                                  int /*iteration*/) {
  FILE* jsonout = NULL;
  FilePath output_file(output_file_);
  FilePath output_dir(output_file.RemoveFileName());

  if (output_dir.CreateDirectoriesRecursively()) {
    jsonout = posix::FOpen(output_file_.c_str(), "w");
  }
  if (jsonout == NULL) {
    // TODO(phosek): report the reason of the failure.
    //
    // We don't do it for now as:
    //
    //   1. There is no urgent need for it.
    //   2. It's a bit involved to make the errno variable thread-safe on
    //      all three operating systems (Linux, Windows, and Mac OS).
    //   3. To interpret the meaning of errno in a thread-safe way,
    //      we need the strerror_r() function, which is not available on
    //      Windows.
    GTEST_LOG_(FATAL) << "Unable to open file \""
                      << output_file_ << "\"";
  }
  std::stringstream stream;
  PrintJsonUnitTest(&stream, unit_test);
  fprintf(jsonout, "%s", StringStreamToString(&stream).c_str());
  fclose(jsonout);
}